

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
pstore::small_vector<int,_3UL>::small_vector
          (small_vector<int,_3UL> *this,small_vector<int,_3UL> *rhs)

{
  size_t new_cap;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<pstore::small_vector<int,_3UL>_> __result;
  small_vector<int,_3UL> *rhs_local;
  small_vector<int,_3UL> *this_local;
  
  small_vector(this);
  new_cap = size(rhs);
  reserve(this,new_cap);
  __first = std::begin<pstore::small_vector<int,3ul>>(rhs);
  __last = std::end<pstore::small_vector<int,3ul>>(rhs);
  __result = std::back_inserter<pstore::small_vector<int,3ul>>(this);
  std::
  copy<pstore::pointer_based_iterator<int_const>,std::back_insert_iterator<pstore::small_vector<int,3ul>>>
            ((pointer_based_iterator<const_int>)__first.pos_,
             (pointer_based_iterator<const_int>)__last.pos_,__result);
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (small_vector const & rhs)
            : small_vector () {
        this->reserve (rhs.size ());
        std::copy (std::begin (rhs), std::end (rhs), std::back_inserter (*this));
    }